

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall ByteCodeGenerator::DefineUserVars(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  ByteCodeWriter *this_00;
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  RegSlot tmpReg;
  PropertyId propertyId;
  uint uVar5;
  RegSlot R0;
  FunctionBody *this_01;
  undefined4 *puVar6;
  ParseNodeVar *pPVar7;
  FunctionBody *pFVar8;
  Type *pTVar9;
  int index;
  ParseNodePtr this_02;
  Symbol *this_03;
  Symbol *pSVar10;
  
  bVar3 = FuncInfo::IsGlobalFunction(funcInfo);
  this_01 = FuncInfo::GetParsedFunctionBody(funcInfo);
  tmpReg = 0xffffffff;
  if (bVar3) {
    tmpReg = FuncInfo::AcquireTmpRegister(funcInfo);
  }
  this_02 = funcInfo->root->pnodeVars;
  if (this_02 != (ParseNodePtr)0x0) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    this_00 = &this->m_writer;
    do {
      pPVar7 = ParseNode::AsParseNodeVar(this_02);
      pSVar10 = pPVar7->sym;
      if ((pSVar10 != (Symbol *)0x0) &&
         ((pPVar7 = ParseNode::AsParseNodeVar(this_02), pPVar7->isBlockScopeFncDeclVar == '\0' ||
          ((pSVar10->field_0x42 & 2) == 0)))) {
        bVar4 = Symbol::IsSpecialSymbol(pSVar10);
        if (bVar4) {
          if ((funcInfo->root->fncFlags & kFunctionHasNonSimpleParameterList) == kFunctionNone) {
            EmitPropStoreForSpecialSymbol(this,pSVar10->location,pSVar10,pSVar10->pid,funcInfo,true)
            ;
            bVar4 = ShouldTrackDebuggerMetadata(this);
            if ((bVar4) && (bVar4 = Symbol::IsInSlot(pSVar10,this,funcInfo,false), !bVar4)) {
              Js::FunctionBody::InsertSymbolToRegSlotList
                        (this_01,&pSVar10->name,pSVar10->location,funcInfo->varRegsCount);
            }
          }
        }
        else {
          if (((*(ushort *)&pSVar10->field_0x42 & 0x40) != 0) ||
             (((*(ushort *)&pSVar10->field_0x42 & 2) != 0 && (this_02->nop == knopVarDecl)))) {
            bVar4 = Symbol::IsArguments(pSVar10);
            if (bVar4) {
              if ((funcInfo->field_0xb4 & 8) != 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar6 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                   ,0x568,"(!funcInfo->GetHasArguments())",
                                   "!funcInfo->GetHasArguments()");
                if (!bVar4) goto LAB_0080dd6e;
                *puVar6 = 0;
              }
              goto LAB_0080dcfd;
            }
            if (((pSVar10->field_0x42 & 0x40) == 0) && (funcInfo->bodyScope == pSVar10->scope)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar6 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x56e,"(funcInfo->bodyScope != sym->GetScope())",
                                 "funcInfo->bodyScope != sym->GetScope()");
              if (!bVar4) goto LAB_0080dd6e;
              *puVar6 = 0;
            }
            this_03 = funcInfo->bodyScope->m_symList;
            while ((this_03 != (Symbol *)0x0 &&
                   (bVar4 = JsUtil::CharacterBuffer<char16_t>::operator==
                                      (&this_03->name,&pSVar10->name), !bVar4))) {
              this_03 = this_03->next;
            }
            pSVar10 = this_03;
            if ((this_03 == (Symbol *)0x0) || ((this_03->field_0x42 & 0x42) != 0)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar6 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x572,"(sym && !sym->GetIsCatch() && !sym->GetIsBlockVar())",
                                 "sym && !sym->GetIsCatch() && !sym->GetIsBlockVar()");
              if (!bVar4) goto LAB_0080dd6e;
              *puVar6 = 0;
            }
          }
          if ((pSVar10->symbolType == STVariable) && ((pSVar10->field_0x43 & 0x40) == 0)) {
            if (bVar3) {
              propertyId = Symbol::EnsurePosition(pSVar10,this);
              if ((this->flags & 0x400) == 0) {
                uVar5 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,propertyId);
                Js::ByteCodeWriter::ElementU(this_00,LdElemUndef,0xfffffffd,uVar5);
              }
              else {
                uVar1 = *(ushort *)&(funcInfo->byteCodeFunction->super_FunctionProxy).field_0x45;
                uVar5 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,propertyId);
                if ((uVar1 >> 8 & 1) == 0) {
                  Js::ByteCodeWriter::ElementScopedU(this_00,LdElemUndefScoped,uVar5);
                }
                else {
                  Js::ByteCodeWriter::ElementRootU(this_00,LdLocalElemUndef,uVar5);
                }
              }
            }
            else {
              bVar4 = Symbol::IsArguments(pSVar10);
              if (bVar4) {
                bVar4 = ShouldTrackDebuggerMetadata(this);
                if (((bVar4) && ((pSVar10->field_0x42 & 0x80) == 0)) &&
                   ((bVar4 = Symbol::IsInSlot(pSVar10,this,funcInfo,false), !bVar4 &&
                    (pSVar10->location != 0xffffffff)))) {
                  Js::FunctionBody::InsertSymbolToRegSlotList
                            (this_01,&pSVar10->name,pSVar10->location,funcInfo->varRegsCount);
                }
              }
              else {
                bVar4 = Symbol::NeedsSlotAlloc(pSVar10,this,funcInfo);
                if ((bVar4) &&
                   (((pSVar10->field_0x43 & 8) == 0 ||
                    ((pSVar10->hasFuncAssignment == true &&
                     (pFVar8 = FuncInfo::GetParsedFunctionBody(funcInfo),
                     ((pFVar8->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) !=
                     Flags_None)))))) {
                  pSVar10->field_0x43 = pSVar10->field_0x43 | 4;
                }
                if ((((pSVar10->field_0x42 & 0x80) == 0) &&
                    (bVar4 = Symbol::IsInSlot(pSVar10,this,funcInfo,false), !bVar4)) ||
                   (((funcInfo->bodyScope->field_0x44 & 2) != 0 && ((funcInfo->field_0xb5 & 1) == 0)
                    ))) {
                  R0 = pSVar10->location;
                  if (R0 == 0xffffffff) {
                    bVar4 = Symbol::IsInSlot(pSVar10,this,funcInfo,false);
                    if (!bVar4) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      *puVar6 = 1;
                      bVar4 = Js::Throw::ReportAssert
                                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                         ,0x5a8,"(sym->IsInSlot(this, funcInfo))",
                                         "sym->IsInSlot(this, funcInfo)");
                      if (!bVar4) {
LAB_0080dd6e:
                        pcVar2 = (code *)invalidInstructionException();
                        (*pcVar2)();
                      }
                      *puVar6 = 0;
                    }
                    R0 = FuncInfo::AcquireTmpRegister(funcInfo);
                  }
                  Js::ByteCodeWriter::Reg1(this_00,LdUndef,R0);
                  EmitLocalPropInit(this,R0,pSVar10,funcInfo);
                  bVar4 = ShouldTrackDebuggerMetadata(this);
                  if (((bVar4) && ((pSVar10->field_0x42 & 0x80) == 0)) &&
                     (bVar4 = Symbol::IsInSlot(pSVar10,this,funcInfo,false), !bVar4)) {
                    Js::FunctionBody::InsertSymbolToRegSlotList
                              (this_01,&pSVar10->name,R0,funcInfo->varRegsCount);
                  }
                  FuncInfo::ReleaseTmpRegister(funcInfo,R0);
                }
              }
            }
            pSVar10->field_0x42 = pSVar10->field_0x42 | 0x80;
          }
        }
      }
LAB_0080dcfd:
      pPVar7 = ParseNode::AsParseNodeVar(this_02);
      this_02 = pPVar7->pnodeNext;
    } while (this_02 != (ParseNodePtr)0x0);
  }
  if (tmpReg != 0xffffffff) {
    FuncInfo::ReleaseTmpRegister(funcInfo,tmpReg);
  }
  if (0 < (funcInfo->nonUserNonTempRegistersToInitialize).
          super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>.count) {
    index = 0;
    do {
      pTVar9 = JsUtil::
               List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(&funcInfo->nonUserNonTempRegistersToInitialize,index);
      Js::ByteCodeWriter::Reg1(&this->m_writer,LdUndef,*pTVar9);
      index = index + 1;
    } while (index < (funcInfo->nonUserNonTempRegistersToInitialize).
                     super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>.count
            );
  }
  return;
}

Assistant:

void ByteCodeGenerator::DefineUserVars(FuncInfo *funcInfo)
{
    // Initialize scope-wide variables on entry to the scope. TODO: optimize by detecting uses that are always reached
    // by an existing initialization.

    BOOL fGlobal = funcInfo->IsGlobalFunction();
    ParseNode *pnode;
    Js::FunctionBody *byteCodeFunction = funcInfo->GetParsedFunctionBody();
    // Global declarations need a temp register to hold the init value, but the node shouldn't get a register.
    // Just assign one on the fly and re-use it for all initializations.
    Js::RegSlot tmpReg = fGlobal ? funcInfo->AcquireTmpRegister() : Js::Constants::NoRegister;

    for (pnode = funcInfo->root->pnodeVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
    {
        Symbol* sym = pnode->AsParseNodeVar()->sym;

        if (sym != nullptr && !(pnode->AsParseNodeVar()->isBlockScopeFncDeclVar && sym->GetIsBlockVar()))
        {
            if (sym->IsSpecialSymbol())
            {
                // Special symbols have already had their initial values stored into their registers.
                // In default-argument case we've stored those values into their slot locations, as well.
                // We must do that because a default parameter may access a special symbol through a scope slot.
                // In the non-default-argument case, though, we didn't yet store the values into the
                // slots so let's do that now.
                if (!funcInfo->root->HasNonSimpleParameterList())
                {
                    EmitPropStoreForSpecialSymbol(sym->GetLocation(), sym, sym->GetPid(), funcInfo, true);

                    if (ShouldTrackDebuggerMetadata() && !sym->IsInSlot(this, funcInfo))
                    {
                        byteCodeFunction->InsertSymbolToRegSlotList(sym->GetName(), sym->GetLocation(), funcInfo->varRegsCount);
                    }
                }

                continue;
            }

            if (sym->GetIsCatch() || (pnode->nop == knopVarDecl && sym->GetIsBlockVar()))
            {
                // The init node was bound to the catch object, because it's inside a catch and has the
                // same name as the catch object. But we want to define a user var at function scope,
                // so find the right symbol. (We'll still assign the RHS value to the catch object symbol.)
                // This also applies to a var declaration in the same scope as a let declaration.
#if DBG
                if (sym->IsArguments())
                {
                    // There is a block scoped var named arguments
                    Assert(!funcInfo->GetHasArguments());
                    continue;
                }
                else if (!sym->GetIsCatch())
                {
                    // Assert that catch cannot be at function scope and let and var at function scope is redeclaration error.
                    Assert(funcInfo->bodyScope != sym->GetScope());
                }
#endif
                sym = funcInfo->bodyScope->FindLocalSymbol(sym->GetName());
                Assert(sym && !sym->GetIsCatch() && !sym->GetIsBlockVar());
            }

            if (sym->GetSymbolType() == STVariable && !sym->GetIsModuleExportStorage())
            {
                if (fGlobal)
                {
                    Js::PropertyId propertyId = sym->EnsurePosition(this);

                    // We do need to initialize some globals to avoid JS errors on loading undefined variables.
                    // But we first need to make sure we're not trashing built-ins.

                    if (this->flags & fscrEval)
                    {
                        if (funcInfo->byteCodeFunction->GetIsStrictMode())
                        {
                            // Check/Init the property of the frame object
                            this->m_writer.ElementRootU(Js::OpCode::LdLocalElemUndef,
                                funcInfo->FindOrAddReferencedPropertyId(propertyId));
                        }
                        else
                        {
                            // The check and the init involve the first element in the scope chain.
                            this->m_writer.ElementScopedU(
                                Js::OpCode::LdElemUndefScoped, funcInfo->FindOrAddReferencedPropertyId(propertyId));
                        }
                    }
                    else
                    {
                        this->m_writer.ElementU(Js::OpCode::LdElemUndef, ByteCodeGenerator::RootObjectRegister,
                            funcInfo->FindOrAddReferencedPropertyId(propertyId));
                    }
                }
                else if (!sym->IsArguments())
                {
                    if (sym->NeedsSlotAlloc(this, funcInfo))
                    {
                        if (!sym->GetHasNonCommittedReference() ||
                            (sym->GetHasFuncAssignment() && funcInfo->GetParsedFunctionBody()->DoStackNestedFunc()))
                        {
                            // No point in trying to optimize if there are no references before we have to commit to slot.
                            // And not safe to delay putting a stack function in the slot, since we may miss boxing.
                            sym->SetIsCommittedToSlot();
                        }
                    }

                    // Undef-initialize the home location if it is a register (not closure-captured, or else capture
                    // is delayed) or a property of an object.
                    if ((!sym->GetHasInit() && !sym->IsInSlot(this, funcInfo)) ||
                        (funcInfo->bodyScope->GetIsObject() && !funcInfo->GetHasCachedScope()))
                    {
                        Js::RegSlot reg = sym->GetLocation();
                        if (reg == Js::Constants::NoRegister)
                        {
                            Assert(sym->IsInSlot(this, funcInfo));
                            reg = funcInfo->AcquireTmpRegister();
                        }
                        this->m_writer.Reg1(Js::OpCode::LdUndef, reg);
                        this->EmitLocalPropInit(reg, sym, funcInfo);

                        if (ShouldTrackDebuggerMetadata() && !sym->GetHasInit() && !sym->IsInSlot(this, funcInfo))
                        {
                            byteCodeFunction->InsertSymbolToRegSlotList(sym->GetName(), reg, funcInfo->varRegsCount);
                        }

                        funcInfo->ReleaseTmpRegister(reg);
                    }
                }
                else if (ShouldTrackDebuggerMetadata())
                {
                    if (!sym->GetHasInit() && !sym->IsInSlot(this, funcInfo))
                    {
                        Js::RegSlot reg = sym->GetLocation();
                        if (reg != Js::Constants::NoRegister)
                        {
                            byteCodeFunction->InsertSymbolToRegSlotList(sym->GetName(), reg, funcInfo->varRegsCount);
                        }
                    }
                }
                sym->SetHasInit(TRUE);
            }
        }

    }
    if (tmpReg != Js::Constants::NoRegister)
    {
        funcInfo->ReleaseTmpRegister(tmpReg);
    }

    for (int i = 0; i < funcInfo->nonUserNonTempRegistersToInitialize.Count(); ++i)
    {
        m_writer.Reg1(Js::OpCode::LdUndef, funcInfo->nonUserNonTempRegistersToInitialize.Item(i));
    }
}